

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::ConfigRuleSyntax::isKind(SyntaxKind kind)

{
  bool bVar1;
  
  bVar1 = true;
  if (((kind != CellConfigRule) && (kind != DefaultConfigRule)) && (kind != InstanceConfigRule)) {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ConfigRuleSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::CellConfigRule:
        case SyntaxKind::DefaultConfigRule:
        case SyntaxKind::InstanceConfigRule:
            return true;
        default:
            return false;
    }
}